

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O2

void __thiscall
Rml::GeometryBackgroundBorder::DrawArcArc
          (GeometryBackgroundBorder *this,Vector2f pos_center,float R,Vector2f r,float a0,float a1,
          ColourbPremultiplied color0,ColourbPremultiplied color1,int num_points)

{
  int *piVar1;
  vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *this_00;
  pointer piVar2;
  pointer piVar3;
  Vector<int> *pVVar4;
  code *pcVar5;
  bool bVar6;
  ColourbPremultiplied CVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float local_88;
  float fStack_84;
  float local_58;
  float fStack_54;
  
  local_88 = r.x;
  fStack_84 = r.y;
  if ((((R <= 0.0) || (num_points < 2)) || (local_88 <= 0.0)) || (fStack_84 <= 0.0)) {
    bVar6 = Assert("RMLUI_ASSERT(num_points >= 2 && R > 0 && r.x > 0 && r.y > 0)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                   ,0x104);
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
  }
  iVar10 = num_points + -1;
  this_00 = this->vertices;
  uVar8 = ((long)(this_00->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this_00->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x14;
  piVar2 = (this->indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (this->indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize
            (this_00,(long)((int)uVar8 + num_points * 2));
  iVar13 = (int)((ulong)((long)piVar2 - (long)piVar3) >> 2);
  ::std::vector<int,_std::allocator<int>_>::resize(this->indices,(long)(iVar10 * 6 + iVar13));
  uVar11 = 0;
  uVar9 = (ulong)(uint)num_points;
  if (num_points < 1) {
    uVar9 = uVar11;
  }
  lVar14 = (long)(int)uVar8 * 0x14;
  for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    fVar15 = (float)(int)uVar11 / (float)iVar10;
    fVar16 = (1.0 - fVar15) * a0 + fVar15 * a1;
    CVar7 = Math::RoundedLerp(fVar15,color0,color1);
    fVar15 = Math::Cos(fVar16);
    fVar16 = Math::Sin(fVar16);
    local_58 = pos_center.x;
    fStack_54 = pos_center.y;
    *(ulong *)((long)&(((this->vertices->
                        super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
                        super__Vector_impl_data._M_start)->position).x + lVar14) =
         CONCAT44(fVar16 * fStack_84 + fStack_54,fVar15 * local_88 + local_58);
    *(ColourbPremultiplied *)
     ((long)&(((this->vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
               _M_impl.super__Vector_impl_data._M_start)->colour).red + lVar14) = CVar7;
    *(ulong *)((long)&(this->vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                      )._M_impl.super__Vector_impl_data._M_start[1].position.x + lVar14) =
         CONCAT44(fVar16 * R + fStack_54,fVar15 * R + local_58);
    *(ColourbPremultiplied *)
     ((long)&(this->vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl
             .super__Vector_impl_data._M_start[1].colour.red + lVar14) = CVar7;
    lVar14 = lVar14 + 0x28;
  }
  pVVar4 = this->indices;
  lVar14 = (long)iVar13 << 2;
  for (lVar12 = 0; lVar12 < iVar10 * 2; lVar12 = lVar12 + 2) {
    piVar2 = (pVVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    iVar13 = (int)uVar8;
    *(int *)((long)piVar2 + lVar14) = iVar13;
    piVar1 = (int *)((long)piVar2 + lVar14 + 4);
    *piVar1 = iVar13 + 2;
    piVar1[1] = iVar13 + 1;
    piVar1[2] = iVar13 + 1;
    piVar1[3] = iVar13 + 2;
    *(int *)((long)piVar2 + lVar14 + 0x14) = iVar13 + 3;
    lVar14 = lVar14 + 0x18;
    uVar8 = (ulong)(iVar13 + 2);
  }
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawArcArc(Vector2f pos_center, float R, Vector2f r, float a0, float a1, ColourbPremultiplied color0,
	ColourbPremultiplied color1, int num_points)
{
	RMLUI_ASSERT(num_points >= 2 && R > 0 && r.x > 0 && r.y > 0);

	const int num_triangles = 2 * (num_points - 1);

	const int offset_vertices = (int)vertices.size();
	const int offset_indices = (int)indices.size();

	vertices.resize(offset_vertices + 2 * num_points);
	indices.resize(offset_indices + 3 * num_triangles);

	for (int i = 0; i < num_points; i++)
	{
		const float t = float(i) / float(num_points - 1);

		const float a = Math::Lerp(t, a0, a1);
		const ColourbPremultiplied color = Math::RoundedLerp(t, color0, color1);
		const Vector2f unit_vector(Math::Cos(a), Math::Sin(a));

		vertices[offset_vertices + 2 * i].position = unit_vector * r + pos_center;
		vertices[offset_vertices + 2 * i].colour = color;
		vertices[offset_vertices + 2 * i + 1].position = unit_vector * R + pos_center;
		vertices[offset_vertices + 2 * i + 1].colour = color;
	}

	for (int i = 0; i < num_triangles; i += 2)
	{
		indices[offset_indices + 3 * i + 0] = offset_vertices + i + 0;
		indices[offset_indices + 3 * i + 1] = offset_vertices + i + 2;
		indices[offset_indices + 3 * i + 2] = offset_vertices + i + 1;

		indices[offset_indices + 3 * i + 3] = offset_vertices + i + 1;
		indices[offset_indices + 3 * i + 4] = offset_vertices + i + 2;
		indices[offset_indices + 3 * i + 5] = offset_vertices + i + 3;
	}
}